

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

PageDesc * page_find_alloc(uc_struct_conflict15 *uc,tb_page_addr_t index,int alloc)

{
  long lVar1;
  gpointer pvVar2;
  gpointer pvVar3;
  void **ppvVar4;
  long lVar5;
  
  ppvVar4 = uc->l1_map + ((long)uc->v_l1_size - 1U & index >> ((byte)uc->v_l1_shift & 0x3f));
  lVar1 = (long)uc->v_l2_levels;
  if (0 < lVar1) {
    lVar5 = lVar1 + 1;
    lVar1 = lVar1 * 10;
    do {
      pvVar3 = *ppvVar4;
      if (*ppvVar4 == (gpointer)0x0) {
        if (alloc == 0) {
          return (PageDesc *)0x0;
        }
        pvVar2 = g_malloc0(0x2000);
        pvVar3 = *ppvVar4;
        if (pvVar3 == (gpointer)0x0) {
          *ppvVar4 = pvVar2;
          pvVar3 = pvVar2;
        }
        else {
          g_free(pvVar2);
        }
      }
      ppvVar4 = (void **)((long)pvVar3 + (ulong)((uint)(index >> ((byte)lVar1 & 0x3f)) & 0x3ff) * 8)
      ;
      lVar5 = lVar5 + -1;
      lVar1 = lVar1 + -10;
    } while (1 < lVar5);
  }
  pvVar3 = *ppvVar4;
  if (*ppvVar4 == (gpointer)0x0) {
    if (alloc == 0) {
      return (PageDesc *)0x0;
    }
    pvVar2 = g_malloc0(0x6000);
    pvVar3 = *ppvVar4;
    if (pvVar3 == (gpointer)0x0) {
      *ppvVar4 = pvVar2;
      pvVar3 = pvVar2;
    }
    else {
      g_free(pvVar2);
    }
  }
  return (PageDesc *)((long)pvVar3 + (ulong)((uint)index & 0x3ff) * 0x18);
}

Assistant:

static PageDesc *page_find_alloc(struct uc_struct *uc, tb_page_addr_t index, int alloc)
{
    PageDesc *pd;
    void **lp;
    int i;

    /* Level 1.  Always allocated.  */
    lp = uc->l1_map + ((index >> uc->v_l1_shift) & (uc->v_l1_size - 1));

    /* Level 2..N-1.  */
    for (i = uc->v_l2_levels; i > 0; i--) {
        void **p = *lp;

        if (p == NULL) {
            void *existing;

            if (!alloc) {
                return NULL;
            }
            p = g_new0(void *, V_L2_SIZE);
            existing = *lp;
            if (*lp == NULL) {
                *lp = p;
            }
            if (unlikely(existing)) {
                g_free(p);
                p = existing;
            }
        }

        lp = p + ((index >> (i * V_L2_BITS)) & (V_L2_SIZE - 1));
    }

    pd = *lp;
    if (pd == NULL) {
        void *existing;

        if (!alloc) {
            return NULL;
        }
        pd = g_new0(PageDesc, V_L2_SIZE);
        existing = *lp;
        if (*lp == NULL) {
            *lp = pd;
        }
        if (unlikely(existing)) {
            g_free(pd);
            pd = existing;
        }
    }

    return pd + (index & (V_L2_SIZE - 1));
}